

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

ssize_t __thiscall
acto::core::runtime_t::send(runtime_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  object_t *sender;
  bool bVar1;
  undefined8 *puVar2;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_28;
  void *local_20;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg_local;
  object_t *target_local;
  runtime_t *this_local;
  
  local_20 = __buf;
  msg_local = (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)
              CONCAT44(in_register_00000034,__fd);
  target_local = (object_t *)this;
  puVar2 = (undefined8 *)(anonymous)::thread_context();
  sender = (object_t *)*puVar2;
  std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::unique_ptr
            (&local_28,
             (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)__buf);
  bVar1 = send_on_behalf(this,(object_t *)CONCAT44(in_register_00000034,__fd),sender,&local_28);
  std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
            (&local_28);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar1);
}

Assistant:

bool runtime_t::send(object_t* const target, std::unique_ptr<msg_t> msg) {
  return send_on_behalf(target, thread_context.active_actor, std::move(msg));
}